

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDevice.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* BlockDevice::GetDeviceList_abi_cxx11_(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RDI;
  char sz [32];
  stat st;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  char local_e8 [40];
  stat64 local_c0;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  uVar7 = 0x61;
  do {
    local_e8[0x10] = '\0';
    local_e8[0x11] = '\0';
    local_e8[0x12] = '\0';
    local_e8[0x13] = '\0';
    local_e8[0x14] = '\0';
    local_e8[0x15] = '\0';
    local_e8[0x16] = '\0';
    local_e8[0x17] = '\0';
    local_e8[0x18] = '\0';
    local_e8[0x19] = '\0';
    local_e8[0x1a] = '\0';
    local_e8[0x1b] = '\0';
    local_e8[0x1c] = '\0';
    local_e8[0x1d] = '\0';
    local_e8[0x1e] = '\0';
    local_e8[0x1f] = '\0';
    local_e8[0] = '\0';
    local_e8[1] = '\0';
    local_e8[2] = '\0';
    local_e8[3] = '\0';
    local_e8[4] = '\0';
    local_e8[5] = '\0';
    local_e8[6] = '\0';
    local_e8[7] = '\0';
    local_e8[8] = '\0';
    local_e8[9] = '\0';
    local_e8[10] = '\0';
    local_e8[0xb] = '\0';
    local_e8[0xc] = '\0';
    local_e8[0xd] = '\0';
    local_e8[0xe] = '\0';
    local_e8[0xf] = '\0';
    snprintf(local_e8,0x20,"/dev/sd%c",uVar7);
    iVar4 = stat64(local_e8,&local_c0);
    if ((iVar4 == 0) && ((local_c0.st_mode & 0xf000) == 0x6000)) {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      sVar5 = strlen(local_e8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,local_e8,local_e8 + sVar5);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(in_RDI,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
    }
    uVar6 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar6;
  } while (uVar6 != 0x71);
  lVar1 = *(long *)in_RDI;
  lVar2 = *(long *)(in_RDI + 8);
  if (lVar1 != lVar2) {
    uVar7 = lVar2 - lVar1 >> 5;
    lVar3 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (lVar1,lVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (lVar1,lVar2);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string> BlockDevice::GetDeviceList()
{
    std::vector<std::string> vDevices;

#ifdef _WIN32
    for (int i = 0; i < 20; ++i)
    {
        std::string str = util::fmt(R"(\\.\PhysicalDrive%d)", i);
        HANDLE h = CreateFile(str.c_str(), 0, 0, nullptr, OPEN_EXISTING, 0, nullptr);

        if (h != INVALID_HANDLE_VALUE)
        {
            CloseHandle(h);
            vDevices.push_back(util::fmt("%d", i));
        }
    }
#elif defined(__linux__)
    for (int i = 0; i < 16; ++i)
    {
        char sz[32] = {};
        snprintf(sz, sizeof(sz), "/dev/sd%c", 'a' + i);

        struct stat st;
        if (!stat(sz, &st) && S_ISBLK(st.st_mode))
            vDevices.push_back(sz);
    }
#else
    CFMutableDictionaryRef matchingDict = IOServiceMatching(kIOMediaClass);
    if (matchingDict != nullptr)
    {
        CFDictionarySetValue(matchingDict, CFSTR(kIOMediaWholeKey), kCFBooleanTrue);    // whole disk objects only

        io_iterator_t iter;
        if (IOServiceGetMatchingServices(kIOMasterPortDefault, matchingDict, &iter) == KERN_SUCCESS)
        {
            for (io_object_t nextMedia; (nextMedia = IOIteratorNext(iter)); IOObjectRelease(nextMedia))
            {
                auto deviceRef = static_cast<CFStringRef>(IORegistryEntryCreateCFProperty(nextMedia, CFSTR(kIOBSDNameKey), kCFAllocatorDefault, 0));
                if (!deviceRef)
                    continue;

                CFMutableStringRef pathRef = CFStringCreateMutable(kCFAllocatorDefault, 0);
                CFStringAppend(pathRef, CFSTR(_PATH_DEV));
                CFStringAppend(pathRef, deviceRef);

                char bsdPath[PATH_MAX];
                CFStringGetCString(pathRef, bsdPath, PATH_MAX, kCFStringEncodingUTF8);
                vDevices.push_back(bsdPath);

                CFRelease(pathRef);
                CFRelease(deviceRef);
            }
        }
    }
#endif

    // Sort the list and return it
    std::sort(vDevices.begin(), vDevices.end());
    return vDevices;
}